

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_hash.cpp
# Opt level: O0

void hashAes1Rx4<false>(void *input,size_t inputSize,void *hash)

{
  ulong uVar1;
  undefined8 *in_RDX;
  long in_RSI;
  long lVar3;
  ulong in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  rx_vec_i128 in;
  rx_vec_i128 in_00;
  rx_vec_i128 in_01;
  rx_vec_i128 in_02;
  rx_vec_i128 in_03;
  rx_vec_i128 in_04;
  rx_vec_i128 in_05;
  rx_vec_i128 in_06;
  rx_vec_i128 in_07;
  rx_vec_i128 in_08;
  rx_vec_i128 in_09;
  rx_vec_i128 key;
  rx_vec_i128 key_00;
  rx_vec_i128 key_01;
  rx_vec_i128 key_02;
  rx_vec_i128 key_03;
  rx_vec_i128 key_04;
  rx_vec_i128 key_05;
  rx_vec_i128 key_06;
  rx_vec_i128 key_07;
  rx_vec_i128 key_08;
  rx_vec_i128 key_09;
  rx_vec_i128 key_10;
  rx_vec_i128 alVar4;
  rx_vec_i128 xkey1;
  rx_vec_i128 xkey0;
  rx_vec_i128 in3;
  rx_vec_i128 in2;
  rx_vec_i128 in1;
  rx_vec_i128 in0;
  rx_vec_i128 state3;
  rx_vec_i128 state2;
  rx_vec_i128 state1;
  rx_vec_i128 state0;
  uint8_t *inputEnd;
  uint8_t *inptr;
  ulong local_178;
  undefined8 *puVar2;
  
  uVar1 = in_RDI + in_RSI;
  puVar2 = in_RDX;
  lVar3 = in_RSI;
  for (local_178 = in_RDI; local_178 < uVar1; local_178 = local_178 + 0x40) {
    in[1] = lVar3;
    in[0] = in_RDI;
    key[1] = in_RSI;
    key[0] = (longlong)puVar2;
    alVar4 = aesenc<false>(in,key);
    key_00[0] = alVar4[1];
    in_00[1] = lVar3;
    in_00[0] = in_RDI;
    key_00[1] = in_RSI;
    alVar4 = aesdec<false>(in_00,key_00);
    key_01[0] = alVar4[1];
    in_01[1] = lVar3;
    in_01[0] = in_RDI;
    key_01[1] = in_RSI;
    alVar4 = aesenc<false>(in_01,key_01);
    key_02[0] = alVar4[1];
    in_02[1] = lVar3;
    in_02[0] = in_RDI;
    key_02[1] = in_RSI;
    alVar4 = aesdec<false>(in_02,key_02);
    puVar2 = alVar4[1];
  }
  alVar4[1] = lVar3;
  alVar4[0] = in_RDI;
  key_03[1] = in_RSI;
  key_03[0] = (longlong)puVar2;
  alVar4 = aesenc<false>(alVar4,key_03);
  key_04[0] = alVar4[1];
  in_03[1] = lVar3;
  in_03[0] = in_RDI;
  key_04[1] = in_RSI;
  alVar4 = aesdec<false>(in_03,key_04);
  key_05[0] = alVar4[1];
  in_04[1] = lVar3;
  in_04[0] = in_RDI;
  key_05[1] = in_RSI;
  alVar4 = aesenc<false>(in_04,key_05);
  key_06[0] = alVar4[1];
  in_05[1] = lVar3;
  in_05[0] = in_RDI;
  key_06[1] = in_RSI;
  alVar4 = aesdec<false>(in_05,key_06);
  key_07[0] = alVar4[1];
  in_06[1] = lVar3;
  in_06[0] = in_RDI;
  key_07[1] = in_RSI;
  alVar4 = aesenc<false>(in_06,key_07);
  key_08[0] = alVar4[1];
  in_07[1] = lVar3;
  in_07[0] = in_RDI;
  key_08[1] = in_RSI;
  alVar4 = aesdec<false>(in_07,key_08);
  key_09[0] = alVar4[1];
  in_08[1] = lVar3;
  in_08[0] = in_RDI;
  key_09[1] = in_RSI;
  alVar4 = aesenc<false>(in_08,key_09);
  key_10[0] = alVar4[1];
  in_09[1] = lVar3;
  in_09[0] = in_RDI;
  key_10[1] = in_RSI;
  aesdec<false>(in_09,key_10);
  *in_RDX = extraout_XMM0_Qa;
  in_RDX[1] = extraout_XMM0_Qb;
  in_RDX[2] = extraout_XMM0_Qa_00;
  in_RDX[3] = extraout_XMM0_Qb_00;
  in_RDX[4] = extraout_XMM0_Qa_01;
  in_RDX[5] = extraout_XMM0_Qb_01;
  in_RDX[6] = extraout_XMM0_Qa_02;
  in_RDX[7] = extraout_XMM0_Qb_02;
  return;
}

Assistant:

void hashAes1Rx4(const void *input, size_t inputSize, void *hash) {
	assert(inputSize % 64 == 0);
	const uint8_t* inptr = (uint8_t*)input;
	const uint8_t* inputEnd = inptr + inputSize;

	rx_vec_i128 state0, state1, state2, state3;
	rx_vec_i128 in0, in1, in2, in3;

	//intial state
	state0 = rx_set_int_vec_i128(AES_HASH_1R_STATE0);
	state1 = rx_set_int_vec_i128(AES_HASH_1R_STATE1);
	state2 = rx_set_int_vec_i128(AES_HASH_1R_STATE2);
	state3 = rx_set_int_vec_i128(AES_HASH_1R_STATE3);

	//process 64 bytes at a time in 4 lanes
	while (inptr < inputEnd) {
		in0 = rx_load_vec_i128((rx_vec_i128*)inptr + 0);
		in1 = rx_load_vec_i128((rx_vec_i128*)inptr + 1);
		in2 = rx_load_vec_i128((rx_vec_i128*)inptr + 2);
		in3 = rx_load_vec_i128((rx_vec_i128*)inptr + 3);

		state0 = aesenc<softAes>(state0, in0);
		state1 = aesdec<softAes>(state1, in1);
		state2 = aesenc<softAes>(state2, in2);
		state3 = aesdec<softAes>(state3, in3);

		inptr += 64;
	}

	//two extra rounds to achieve full diffusion
	rx_vec_i128 xkey0 = rx_set_int_vec_i128(AES_HASH_1R_XKEY0);
	rx_vec_i128 xkey1 = rx_set_int_vec_i128(AES_HASH_1R_XKEY1);

	state0 = aesenc<softAes>(state0, xkey0);
	state1 = aesdec<softAes>(state1, xkey0);
	state2 = aesenc<softAes>(state2, xkey0);
	state3 = aesdec<softAes>(state3, xkey0);

	state0 = aesenc<softAes>(state0, xkey1);
	state1 = aesdec<softAes>(state1, xkey1);
	state2 = aesenc<softAes>(state2, xkey1);
	state3 = aesdec<softAes>(state3, xkey1);

	//output hash
	rx_store_vec_i128((rx_vec_i128*)hash + 0, state0);
	rx_store_vec_i128((rx_vec_i128*)hash + 1, state1);
	rx_store_vec_i128((rx_vec_i128*)hash + 2, state2);
	rx_store_vec_i128((rx_vec_i128*)hash + 3, state3);
}